

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.c
# Opt level: O2

char * nrv_alloc(char *s,char **rve,int n)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  
  pcVar2 = rv_alloc(n);
  pcVar3 = pcVar2;
  if (pcVar2 != (char *)0x0) {
    for (; cVar1 = *s, *pcVar3 = cVar1, cVar1 != '\0'; s = s + 1) {
      pcVar3 = pcVar3 + 1;
    }
    if (rve != (char **)0x0) {
      *rve = pcVar3;
    }
  }
  return pcVar2;
}

Assistant:

static char *
nrv_alloc(char *s, char **rve, int n)
{
    char *rv, *t;

    rv = rv_alloc(n);
    if (rv == NULL)
        return NULL;
    t = rv;
    while((*t = *s++)) t++;
    if (rve)
        *rve = t;
    return rv;
}